

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::RgbaInputFile::RgbaInputFile(RgbaInputFile *this,char *name,int numThreads)

{
  RgbaChannels RVar1;
  void *pvVar2;
  undefined8 *in_RDI;
  RgbaChannels in_stack_00000034;
  InputFile *in_stack_00000038;
  RgbaChannels rgbaChannels;
  FromYca *in_stack_00000040;
  int in_stack_000001e4;
  char *in_stack_000001e8;
  InputFile *in_stack_000001f0;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__RgbaInputFile_00562090;
  pvVar2 = operator_new(0x10);
  InputFile::InputFile(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4);
  in_RDI[1] = pvVar2;
  in_RDI[2] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffdb);
  RVar1 = channels((RgbaInputFile *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if ((RVar1 & WRITE_YC) != 0) {
    pvVar2 = operator_new(0x188);
    FromYca::FromYca(in_stack_00000040,in_stack_00000038,in_stack_00000034);
    in_RDI[2] = pvVar2;
  }
  return;
}

Assistant:

RgbaInputFile::RgbaInputFile (const char name[], int numThreads):
    _inputFile (new InputFile (name, numThreads)),
    _fromYca (0),
    _channelNamePrefix ("")
{
    RgbaChannels rgbaChannels = channels();

    if (rgbaChannels & (WRITE_Y | WRITE_C))
	_fromYca = new FromYca (*_inputFile, rgbaChannels);
}